

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

void stats_print_atexit(void)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  int iVar3;
  tsd_t *tsd;
  tcache_slow_t *ptVar4;
  ulong uVar5;
  ulong uVar6;
  arena_t *arena;
  long *in_FS_OFFSET;
  
  if (duckdb_je_tsd_booted) {
    tsd = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
    if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
      tsd = duckdb_je_tsd_fetch_slow(tsd,false);
    }
  }
  else {
    tsd = (tsd_t *)0x0;
  }
  uVar5 = (ulong)narenas_total.repr;
  if (narenas_total.repr != 0) {
    uVar6 = 0;
    do {
      arena = (arena_t *)duckdb_je_arenas[uVar6].repr;
      if (arena == (arena_t *)0x0) {
        arena = (arena_t *)0x0;
      }
      if (arena != (arena_t *)0x0) {
        __mutex = (pthread_mutex_t *)((long)&(arena->tcache_ql_mtx).field_0 + 0x48);
        iVar3 = pthread_mutex_trylock(__mutex);
        if (iVar3 != 0) {
          duckdb_je_malloc_mutex_lock_slow(&arena->tcache_ql_mtx);
          (arena->tcache_ql_mtx).field_0.field_0.locked.repr = true;
        }
        puVar1 = &(arena->tcache_ql_mtx).field_0.field_0.prof_data.n_lock_ops;
        *puVar1 = *puVar1 + 1;
        if (&((arena->tcache_ql_mtx).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
          *(tsd_t **)((long)&(arena->tcache_ql_mtx).field_0 + 0x30) = tsd;
          ppwVar2 = &(arena->tcache_ql_mtx).field_0.witness.link.qre_prev;
          *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
        }
        ptVar4 = (arena->tcache_ql).qlh_first;
        while (ptVar4 != (tcache_slow_t *)0x0) {
          duckdb_je_tcache_stats_merge((tsdn_t *)tsd,ptVar4->tcache,arena);
          ptVar4 = (ptVar4->link).qre_next;
          if (ptVar4 == (arena->tcache_ql).qlh_first) {
            ptVar4 = (tcache_slow_t *)0x0;
          }
        }
        (arena->tcache_ql_mtx).field_0.field_0.locked.repr = false;
        pthread_mutex_unlock(__mutex);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar5);
  }
  duckdb_je_malloc_stats_print((write_cb_t *)0x0,(void *)0x0,duckdb_je_opt_stats_print_opts);
  return;
}

Assistant:

static void
stats_print_atexit(void) {
	if (config_stats) {
		tsdn_t *tsdn;
		unsigned narenas, i;

		tsdn = tsdn_fetch();

		/*
		 * Merge stats from extant threads.  This is racy, since
		 * individual threads do not lock when recording tcache stats
		 * events.  As a consequence, the final stats may be slightly
		 * out of date by the time they are reported, if other threads
		 * continue to allocate.
		 */
		for (i = 0, narenas = narenas_total_get(); i < narenas; i++) {
			arena_t *arena = arena_get(tsdn, i, false);
			if (arena != NULL) {
				tcache_slow_t *tcache_slow;

				malloc_mutex_lock(tsdn, &arena->tcache_ql_mtx);
				ql_foreach(tcache_slow, &arena->tcache_ql,
				    link) {
					tcache_stats_merge(tsdn,
					    tcache_slow->tcache, arena);
				}
				malloc_mutex_unlock(tsdn,
				    &arena->tcache_ql_mtx);
			}
		}
	}
	je_malloc_stats_print(NULL, NULL, opt_stats_print_opts);
}